

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall cmQtAutoGenInitializer::handleSkipPch(cmQtAutoGenInitializer *this,cmSourceFile *sf)

{
  cmSourceFile *this_00;
  bool bVar1;
  bool bVar2;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *this_01;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  byte local_7d;
  byte local_6a;
  allocator<char> local_69;
  string local_68;
  cmValue local_48;
  reference local_40;
  pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
  *pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
  *__range1;
  bool skipPch;
  cmSourceFile *sf_local;
  cmQtAutoGenInitializer *this_local;
  
  bVar1 = true;
  this_01 = &(this->AutogenTarget).Sources;
  __end1 = std::
           unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
           ::begin(this_01);
  pair = (pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>
          *)std::
            unordered_map<cmSourceFile_*,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>,_std::hash<cmSourceFile_*>,_std::equal_to<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>_>_>
            ::end(this_01);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false>
                              *)&pair), bVar2) {
    local_40 = std::__detail::
               _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
               ::operator*(&__end1);
    bVar2 = cmSourceFile::GetIsGenerated(local_40->first,GlobalAndLocal);
    local_6a = 0;
    local_7d = 0;
    local_a2 = 0;
    if (!bVar2) {
      this_00 = local_40->first;
      std::allocator<char>::allocator();
      local_6a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"SKIP_PRECOMPILE_HEADERS",&local_69);
      local_7d = 1;
      local_48 = cmSourceFile::GetProperty(this_00,&local_68);
      bVar2 = cmValue::operator_cast_to_bool(&local_48);
      local_a2 = bVar2 ^ 0xff;
    }
    if ((local_7d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_68);
    }
    if ((local_6a & 1) != 0) {
      std::allocator<char>::~allocator(&local_69);
    }
    if ((local_a2 & 1) != 0) {
      bVar1 = false;
    }
    std::__detail::
    _Node_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmQtAutoGenInitializer::MUFile,_std::default_delete<cmQtAutoGenInitializer::MUFile>_>_>,_false,_false>
    ::operator++(&__end1);
  }
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"SKIP_PRECOMPILE_HEADERS",&local_a1);
    cmSourceFile::SetProperty(sf,&local_a0,"ON");
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::handleSkipPch(cmSourceFile* sf)
{
  bool skipPch = true;
  for (auto const& pair : this->AutogenTarget.Sources) {
    if (!pair.first->GetIsGenerated() &&
        !pair.first->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
      skipPch = false;
    }
  }

  if (skipPch) {
    sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
  }
}